

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O3

bool __thiscall CEditor::PopupColorPicker(CEditor *this,void *pContext,CUIRect View)

{
  CUI *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  float *pfVar4;
  long lVar5;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  undefined4 uVar15;
  CQuadItem QuadItemMarker;
  float Y;
  float X;
  CUIRect Palette;
  CUIRect HuePicker;
  CUIRect SVPicker;
  float local_14c;
  undefined8 local_138;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  CUIRect local_e8;
  CUIRect local_d8;
  CUIRect local_c8;
  CUIRect local_b8;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined4 local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  float fStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = View;
  CUIRect::HSplitBottom(&local_b8,20.0,&local_c8,&local_e8);
  CUIRect::VSplitRight(&local_c8,20.0,&local_c8,&local_d8);
  CUIRect::VSplitLeft(&local_d8,4.0,(CUIRect *)0x0,&local_d8);
  CUIRect::HSplitTop(&local_e8,4.0,(CUIRect *)0x0,&local_e8);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])(this->m_pGraphics,0xffffffff);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_138._0_4_ = *(float *)&(this->m_SelectedPickerColor).field_0;
  local_138._4_4_ = (this->m_SelectedPickerColor).field_1;
  local_14c = (this->m_SelectedPickerColor).field_2.z;
  fVar10 = (float)local_138 * 6.0;
  local_88 = 0;
  if ((uint)((int)fVar10 % 6) < 6) {
    fStack_58 = fVar10 - (float)(int)fVar10;
    fVar14 = fStack_58 * -0.0 + 1.0;
    fStack_54 = 1.0 - fStack_58;
    fVar6 = fStack_54 * -0.0 + 1.0;
    switch((int)fVar10 % 6) {
    case 0:
      fStack_84 = 1.0;
      fStack_7c = 1.0;
      fStack_58 = 1.0 - fStack_54;
      fStack_5c = 1.0;
      fStack_54 = 0.0;
      fStack_80 = fVar6;
      break;
    case 1:
      fStack_80 = 1.0;
      fStack_7c = 1.0;
      fStack_5c = 1.0 - fStack_58;
      fStack_58 = 1.0;
      fStack_54 = 0.0;
      fStack_84 = fVar14;
      break;
    case 2:
      fStack_84 = 1.0;
      fStack_80 = 1.0;
      fStack_54 = 1.0 - fStack_54;
      fStack_5c = 0.0;
      fStack_58 = 1.0;
      fStack_7c = fVar6;
      break;
    case 3:
      fStack_84 = 1.0;
      fStack_7c = 1.0;
      fStack_58 = 1.0 - fStack_58;
      fStack_5c = 0.0;
      fStack_54 = 1.0;
      fStack_80 = fVar14;
      break;
    case 4:
      fStack_80 = 1.0;
      fStack_7c = 1.0;
      fStack_5c = 1.0 - fStack_54;
      fStack_58 = 0.0;
      fStack_54 = 1.0;
      fStack_84 = fVar6;
      break;
    case 5:
      fStack_84 = 1.0;
      fStack_80 = 1.0;
      fStack_5c = 1.0;
      fStack_58 = 0.0;
      fStack_7c = fVar14;
    }
  }
  else {
    fStack_84 = 0.0;
    fStack_80 = 0.0;
    fStack_7c = 0.0;
    fStack_5c = 0.0;
    fStack_58 = 0.0;
    fStack_54 = 0.0;
  }
  uStack_50 = 0x3f800000;
  uStack_60 = 2;
  uStack_64 = 0x3f800000;
  uStack_74 = 1;
  uStack_78 = 0x3f800000;
  uStack_4c = 3;
  local_48 = CONCAT44(fStack_80,fStack_84);
  uStack_3c = 0x3f800000;
  fStack_70 = fStack_5c;
  fStack_6c = fStack_58;
  local_68 = fStack_54;
  fStack_40 = fStack_7c;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
  local_f8 = local_c8.x;
  fStack_f4 = local_c8.y;
  fStack_f0 = local_c8.w;
  fStack_ec = local_c8.h;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_f8,1);
  local_88 = 0;
  fStack_84 = 0.0;
  fStack_80 = 0.0;
  fStack_7c = 0.0;
  uStack_78 = 0;
  uStack_74 = 1;
  fStack_70 = 0.0;
  fStack_6c = 0.0;
  local_68 = 0.0;
  uStack_64 = 0;
  uStack_60 = 2;
  fStack_5c = 0.0;
  fStack_58 = 0.0;
  fStack_54 = 0.0;
  uStack_50 = 0x3f800000;
  uStack_4c = 3;
  local_48 = 0;
  fStack_40 = 0.0;
  uStack_3c = 0x3f800000;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_f8,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  fVar10 = (float)local_138._4_4_ * local_c8.w;
  fVar6 = (1.0 - local_14c) * local_c8.h;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  fVar14 = local_c8.x + fVar10;
  fVar7 = local_c8.y + fVar6;
  this_00 = &this->m_UI;
  fVar8 = CUI::PixelSize(this_00);
  fVar9 = CUI::PixelSize(this_00);
  local_9c = CUI::PixelSize(this_00);
  local_9c = local_9c * 11.0;
  local_a8 = fVar14;
  local_a4 = fVar8 * -5.0 + fVar7;
  local_a0 = fVar9;
  fVar14 = CUI::PixelSize(this_00);
  fVar7 = CUI::PixelSize(this_00);
  local_8c = CUI::PixelSize(this_00);
  local_98 = fVar14 * -5.0 + fVar10 + local_c8.x;
  local_94 = fVar6 + local_c8.y;
  local_90 = fVar7 * 11.0;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_a8,2);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  bVar2 = CUI::DoPickerLogic(this_00,&PopupColorPicker::s_SVPicker,&local_c8,&local_fc,&local_100);
  if (bVar2) {
    local_14c = 1.0 - local_100 / local_c8.h;
    local_138 = CONCAT44(local_fc / local_c8.w,(float)local_138);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  fVar6 = local_d8.h / 6.0;
  pfVar4 = PopupColorPicker::s_aColorIndices[1] + 2;
  lVar5 = 0;
  fVar10 = 0.0;
  uVar11 = 0x3f800000;
  uVar15 = 0;
  do {
    lVar1 = lVar5 + 1;
    fVar14 = *pfVar4;
    local_88 = 0;
    uStack_78 = 0x3f800000;
    uStack_74 = 1;
    uStack_64 = 0x3f800000;
    uStack_60 = 2;
    uStack_50 = 0x3f800000;
    uStack_4c = 3;
    local_48 = *(undefined8 *)*(float (*) [3])(pfVar4 + -2);
    uVar12 = (undefined4)local_48;
    uVar13 = (undefined4)((ulong)local_48 >> 0x20);
    uStack_3c = 0x3f800000;
    fStack_84 = (float)uVar11;
    fStack_80 = (float)uVar15;
    fStack_7c = fVar10;
    fStack_70 = (float)uVar11;
    fStack_6c = (float)uVar15;
    local_68 = fVar10;
    fStack_5c = (float)uVar12;
    fStack_58 = (float)uVar13;
    fStack_54 = fVar14;
    fStack_40 = fVar14;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
    local_10c = (float)(int)lVar5 * fVar6 + local_d8.y;
    local_110 = local_d8.x;
    local_108 = local_d8.w;
    local_104 = fVar6;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_110,1);
    pfVar4 = pfVar4 + 3;
    lVar5 = lVar1;
    fVar10 = fVar14;
    uVar11 = uVar12;
    uVar15 = uVar13;
  } while (lVar1 != 6);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  fVar10 = (1.0 - (float)local_138) * local_d8.h;
  local_104 = CUI::PixelSize(this_00);
  local_110 = local_d8.x;
  local_108 = local_d8.w;
  local_10c = fVar10 + local_d8.y;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_110,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  bVar2 = CUI::DoPickerLogic(this_00,&PopupColorPicker::s_HuePicker,&local_d8,&local_fc,&local_100);
  if (bVar2) {
    local_138 = CONCAT44(local_138._4_4_,1.0 - local_100 / local_d8.h);
  }
  CUIRect::Draw(&local_e8,&this->m_SelectedColor,0.0,0);
  iVar3 = DoButton_Editor_Common
                    (this,&PopupColorPicker::s_Palette,(char *)0x0,0,&local_e8,0,(char *)0x0);
  if ((iVar3 != 0) && (0.0 < (this->m_SelectedColor).field_3.w)) {
    fVar10 = (this->m_SelectedColor).field_0.x;
    fVar6 = (this->m_SelectedColor).field_1.y;
    fVar14 = (this->m_SelectedColor).field_2.z;
    fVar7 = fVar10;
    if (fVar6 <= fVar10) {
      fVar7 = fVar6;
    }
    if (fVar14 <= fVar7) {
      fVar7 = fVar14;
    }
    local_14c = fVar10;
    if (fVar10 <= fVar6) {
      local_14c = fVar6;
    }
    if (local_14c <= fVar14) {
      local_14c = fVar14;
    }
    if ((local_14c != fVar7) || (NAN(local_14c) || NAN(fVar7))) {
      fVar8 = local_14c - fVar7;
      if ((local_14c != fVar10) || (NAN(local_14c) || NAN(fVar10))) {
        if ((local_14c != fVar6) || (NAN(local_14c) || NAN(fVar6))) {
          fVar8 = (fVar10 - fVar6) / fVar8 + 4.0;
        }
        else {
          fVar8 = (fVar14 - fVar10) / fVar8 + 2.0;
        }
      }
      else {
        fVar8 = (fVar6 - fVar14) / fVar8;
      }
    }
    else {
      fVar8 = 0.0;
    }
    fVar8 = fVar8 / 6.0;
    local_138 = CONCAT44(-(uint)(local_14c != 0.0) & (uint)((local_14c - fVar7) / local_14c),
                         ~-(uint)(fVar8 < 0.0) & (uint)fVar8 |
                         (uint)(fVar8 + 1.0) & -(uint)(fVar8 < 0.0));
  }
  (this->m_SelectedPickerColor).field_0 =
       (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(int)local_138;
  (this->m_SelectedPickerColor).field_1 =
       (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)(int)((ulong)local_138 >> 0x20);
  (this->m_SelectedPickerColor).field_2.z = local_14c;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool CEditor::PopupColorPicker(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect SVPicker, HuePicker, Palette;
	View.HSplitBottom(20.0f, &SVPicker, &Palette);
	SVPicker.VSplitRight(20.0f, &SVPicker, &HuePicker);
	HuePicker.VSplitLeft(4.0f, 0x0, &HuePicker);
	Palette.HSplitTop(4.0f, 0x0, &Palette);

	pEditor->Graphics()->TextureClear();
	pEditor->Graphics()->QuadsBegin();

	// base: white - hue
	vec3 hsv = pEditor->m_SelectedPickerColor;
	IGraphics::CColorVertex ColorArray[4];

	vec3 c = HsvToRgb(vec3(hsv.x, 0.0f, 1.0f));
	ColorArray[0] = IGraphics::CColorVertex(0, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 1.0f, 1.0f));
	ColorArray[1] = IGraphics::CColorVertex(1, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 1.0f, 1.0f));
	ColorArray[2] = IGraphics::CColorVertex(2, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 0.0f, 1.0f));
	ColorArray[3] = IGraphics::CColorVertex(3, c.r, c.g, c.b, 1.0f);

	pEditor->Graphics()->SetColorVertex(ColorArray, 4);

	IGraphics::CQuadItem QuadItem(SVPicker.x, SVPicker.y, SVPicker.w, SVPicker.h);
	pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);

	// base: transparent - black
	ColorArray[0] = IGraphics::CColorVertex(0, 0.0f, 0.0f, 0.0f, 0.0f);
	ColorArray[1] = IGraphics::CColorVertex(1, 0.0f, 0.0f, 0.0f, 0.0f);
	ColorArray[2] = IGraphics::CColorVertex(2, 0.0f, 0.0f, 0.0f, 1.0f);
	ColorArray[3] = IGraphics::CColorVertex(3, 0.0f, 0.0f, 0.0f, 1.0f);

	pEditor->Graphics()->SetColorVertex(ColorArray, 4);

	pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);

	pEditor->Graphics()->QuadsEnd();

	// marker
	vec2 Marker = vec2(hsv.y, (1.0f - hsv.z)) * vec2(SVPicker.w, SVPicker.h);
	pEditor->Graphics()->QuadsBegin();
	pEditor->Graphics()->SetColor(0.5f, 0.5f, 0.5f, 1.0f);
	IGraphics::CQuadItem aMarker[2];
	aMarker[0] = IGraphics::CQuadItem(SVPicker.x+Marker.x, SVPicker.y+Marker.y - 5.0f*pEditor->UI()->PixelSize(), pEditor->UI()->PixelSize(), 11.0f*pEditor->UI()->PixelSize());
	aMarker[1] = IGraphics::CQuadItem(SVPicker.x+Marker.x - 5.0f*pEditor->UI()->PixelSize(), SVPicker.y+Marker.y, 11.0f*pEditor->UI()->PixelSize(), pEditor->UI()->PixelSize());
	pEditor->Graphics()->QuadsDrawTL(aMarker, 2);
	pEditor->Graphics()->QuadsEnd();

	// logic
	float X, Y;
	static int s_SVPicker = 0;
	if(pEditor->UI()->DoPickerLogic(&s_SVPicker, &SVPicker, &X, &Y))
	{
		hsv.y = X/SVPicker.w;
		hsv.z = 1.0f - Y/SVPicker.h;
	}

	// hue slider
	static const float s_aColorIndices[7][3] = {
		{1.0f, 0.0f, 0.0f}, // red
		{1.0f, 0.0f, 1.0f},	// magenta
		{0.0f, 0.0f, 1.0f}, // blue
		{0.0f, 1.0f, 1.0f}, // cyan
		{0.0f, 1.0f, 0.0f}, // green
		{1.0f, 1.0f, 0.0f}, // yellow
		{1.0f, 0.0f, 0.0f}  // red
	};

	pEditor->Graphics()->QuadsBegin();
	vec4 ColorTop, ColorBottom;
	float Offset = HuePicker.h/6.0f;
	for(int j = 0; j < 6; j++)
	{
		ColorTop = vec4(s_aColorIndices[j][0], s_aColorIndices[j][1], s_aColorIndices[j][2], 1.0f);
		ColorBottom = vec4(s_aColorIndices[j+1][0], s_aColorIndices[j+1][1], s_aColorIndices[j+1][2], 1.0f);

		ColorArray[0] = IGraphics::CColorVertex(0, ColorTop.r, ColorTop.g, ColorTop.b, ColorTop.a);
		ColorArray[1] = IGraphics::CColorVertex(1, ColorTop.r, ColorTop.g, ColorTop.b, ColorTop.a);
		ColorArray[2] = IGraphics::CColorVertex(2, ColorBottom.r, ColorBottom.g, ColorBottom.b, ColorBottom.a);
		ColorArray[3] = IGraphics::CColorVertex(3, ColorBottom.r, ColorBottom.g, ColorBottom.b, ColorBottom.a);
		pEditor->Graphics()->SetColorVertex(ColorArray, 4);
		IGraphics::CQuadItem QuadItem(HuePicker.x, HuePicker.y+Offset*j, HuePicker.w, Offset);
		pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);
	}

	// marker
	pEditor->Graphics()->SetColor(0.5f, 0.5f, 0.5f, 1.0f);
	IGraphics::CQuadItem QuadItemMarker(HuePicker.x, HuePicker.y + (1.0f - hsv.x) * HuePicker.h, HuePicker.w, pEditor->UI()->PixelSize());
	pEditor->Graphics()->QuadsDrawTL(&QuadItemMarker, 1);

	pEditor->Graphics()->QuadsEnd();

	static int s_HuePicker = 0;
	if(pEditor->UI()->DoPickerLogic(&s_HuePicker, &HuePicker, &X, &Y))
	{
		hsv.x = 1.0f - Y/HuePicker.h;
	}

	// palette
	static int s_Palette = 0;
	Palette.Draw(pEditor->m_SelectedColor, 0.0f, CUIRect::CORNER_NONE);
	if(pEditor->DoButton_Editor_Common(&s_Palette, 0x0, 0, &Palette, 0, 0x0))
	{
		if(pEditor->m_SelectedColor.a > 0.0f)
			hsv = RgbToHsv(vec3(pEditor->m_SelectedColor.r, pEditor->m_SelectedColor.g, pEditor->m_SelectedColor.b));
	}

	pEditor->m_SelectedPickerColor = hsv;

	return false;
}